

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::resizeImageBilinear<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long w,long h)

{
  int iVar1;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  reference pvVar2;
  long in_RCX;
  long in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  int d;
  long i;
  long k;
  float fy;
  float fx;
  vector<int,_std::allocator<int>_> v;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *ret;
  undefined8 in_stack_ffffffffffffff38;
  int d_00;
  long i_00;
  long in_stack_ffffffffffffff40;
  long k_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *p;
  int local_6c;
  long local_68;
  long local_60;
  vector<int,_std::allocator<int>_> local_38;
  long local_20;
  long local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  d_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  p = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI);
  this = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(long)iVar1;
  std::allocator<int>::allocator((allocator<int> *)0x135eea);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::allocator<int>::~allocator((allocator<int> *)0x135f10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40
             ,d_00);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                (this,(vector<int,_std::allocator<int>_> *)p,(float)((ulong)in_RDI >> 0x20),
                 SUB84(in_RDI,0));
      local_6c = 0;
      while (in_stack_ffffffffffffff50 = local_6c,
            in_stack_ffffffffffffff54 =
                 Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
            in_stack_ffffffffffffff50 < in_stack_ffffffffffffff54) {
        i_00 = local_68;
        k_00 = local_60;
        iVar1 = local_6c;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_6c);
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (in_RDI,i_00,k_00,iVar1,(store_t)*pvVar2);
        local_6c = local_6c + 1;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return p;
}

Assistant:

Image<T> resizeImageBilinear(const Image<T> &image, long w, long h)
{
  std::vector<typename Image<T>::work_t> v(image.getDepth());
  Image<T> ret(w, h, image.getDepth());

  const float fx=static_cast<float>(image.getWidth())/w;
  const float fy=static_cast<float>(image.getHeight())/h;

  for (long k=0; k<h; k++)
  {
    for (long i=0; i<w; i++)
    {
      image.getBilinear(v, i*fx, k*fy);

      for (int d=0; d<image.getDepth(); d++)
      {
        ret.set(i, k, d, static_cast<typename Image<T>::store_t>(v[d]));
      }
    }
  }

  return ret;
}